

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::SetRewardForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,Scope *Y,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys,Scope *O,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Os,double reward)

{
  reference A;
  undefined8 in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  undefined4 in_ESI;
  Scope *in_RDI;
  FactoredDecPOMDPDiscrete *in_R9;
  Scope *in_XMM0_Qa;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *As_00;
  Scope *in_stack_00000010;
  double r_weighted;
  double P_yo_xa;
  double r_xa;
  size_type in_stack_ffffffffffffff78;
  vector<Scope,_std::allocator<Scope>_> *in_stack_ffffffffffffff80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_ffffffffffffffb0;
  
  Ys_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          (**(code **)((in_RDI->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x9c))(in_RDI,in_ESI,in_RDX,in_RCX);
  A = std::vector<Scope,_std::allocator<Scope>_>::at
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<Scope,_std::allocator<Scope>_>::at
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  As_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          MultiAgentDecisionProcessDiscreteFactoredStates::GetYOProbability
                    (in_stack_ffffffffffffffb0,in_RDI,in_RDX,A,in_stack_ffffffffffffff90,
                     in_stack_00000010,Ys_00,in_XMM0_Qa,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_R9);
  SetRewardForLRF(in_R9,(Index)((ulong)in_XMM0_Qa >> 0x20),
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ((double)As_00 * (double)in_XMM0_Qa + (double)Ys_00),As_00,
                  (double)As_00 * (double)in_XMM0_Qa);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::SetRewardForLRF(Index LRF,
            const vector<Index>& Xs,
            const vector<Index>& As,
            const Scope& Y,
            const vector<Index>& Ys,
            const Scope& O,
            const vector<Index>& Os,
            double reward
        )
{
#if DEBUG_SETR 
    string indent = "\t";
    cerr<<indent;
    cerr<< "SetRewardForLRF with Y and O scopes called: LRF="<<LRF<<
        ", r="<<reward<<endl;
#endif
    double r_xa = GetLRFReward(LRF, Xs, As);
    double P_yo_xa = GetYOProbability( 
            _m_sfScopes.at(LRF), Xs,
            _m_agScopes.at(LRF), As,
            Y, Ys,
            O, Os);
    double r_weighted = P_yo_xa * reward;
    r_xa += r_weighted;
    SetRewardForLRF(LRF, Xs, As, r_xa);
}